

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  uint uVar2;
  word *pwVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  SegmentReader *pSVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  uint uVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  bool bVar16;
  Reader RVar17;
  SegmentReader *pSVar6;
  undefined4 extraout_var_00;
  
  pSVar6 = this->segment;
  pWVar14 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar14 = this->pointer;
  }
  pWVar15 = pWVar14 + 1;
  lVar8 = (long)((int)*(uint64_t *)&(pWVar14->offsetAndKind).value >> 2);
  if (pSVar6 == (SegmentReader *)0x0) {
    pWVar12 = pWVar15 + lVar8;
  }
  else {
    pwVar3 = (pSVar6->ptr).ptr;
    pWVar12 = (WirePointer *)(pwVar3 + (pSVar6->ptr).size_);
    if (((long)pwVar3 - (long)pWVar15 >> 3 <= lVar8) &&
       (lVar8 <= (long)pWVar12 - (long)pWVar15 >> 3)) {
      pWVar12 = pWVar15 + lVar8;
    }
  }
  uVar2 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
  if ((pWVar14->field_1).upper32Bits != 0 || uVar2 != 0) {
    pWVar15 = pWVar14;
    if ((pSVar6 != (SegmentReader *)0x0) && ((uVar2 & 3) == 2)) {
      iVar5 = (*pSVar6->arena->_vptr_Arena[2])();
      pSVar6 = (SegmentReader *)CONCAT44(extraout_var,iVar5);
      if (pSVar6 == (SegmentReader *)0x0) {
        getBlob<capnp::Text>();
        pWVar12 = (WirePointer *)0x0;
      }
      else {
        uVar2 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
        uVar10 = (ulong)(uVar2 >> 3);
        uVar11 = (pSVar6->ptr).size_;
        if ((long)uVar11 < (long)uVar10) {
          uVar10 = uVar11;
        }
        uVar9 = 2 - (ulong)((uVar2 & 4) == 0);
        if (uVar9 + uVar10 <= uVar11) {
          pWVar15 = (WirePointer *)((pSVar6->ptr).ptr + uVar10);
          uVar11 = pSVar6->readLimiter->limit;
          if (uVar9 <= uVar11) {
            pSVar6->readLimiter->limit = uVar11 - uVar9;
            pWVar1 = pWVar15 + 1;
            if ((*(uint64_t *)&(pWVar14->offsetAndKind).value & 4) == 0) {
              lVar8 = (long)((int)*(uint64_t *)&(pWVar15->offsetAndKind).value >> 2);
              pwVar3 = (pSVar6->ptr).ptr;
              pWVar12 = (WirePointer *)(pwVar3 + (pSVar6->ptr).size_);
              if (((long)pwVar3 - (long)pWVar1 >> 3 <= lVar8) &&
                 (lVar8 <= (long)pWVar12 - (long)pWVar1 >> 3)) {
                pWVar12 = pWVar1 + lVar8;
              }
            }
            else {
              iVar5 = (*pSVar6->arena->_vptr_Arena[2])
                                (pSVar6->arena,(ulong)(pWVar15->field_1).upper32Bits);
              pSVar7 = (SegmentReader *)CONCAT44(extraout_var_00,iVar5);
              if (pSVar7 == (SegmentReader *)0x0) {
                getBlob<capnp::Text>();
              }
              else {
                uVar2 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
                if ((uVar2 & 3) == 2) {
                  uVar11 = (ulong)(uVar2 >> 3);
                  sVar4 = (pSVar7->ptr).size_;
                  if ((long)sVar4 < (long)uVar11) {
                    uVar11 = sVar4;
                  }
                  pWVar12 = (WirePointer *)((pSVar7->ptr).ptr + uVar11);
                  pWVar15 = pWVar1;
                  pSVar6 = pSVar7;
                  goto LAB_0018377f;
                }
                getBlob<capnp::Text>();
              }
              pWVar12 = (WirePointer *)0x0;
              pWVar15 = pWVar1;
            }
            goto LAB_0018377f;
          }
          (*pSVar6->arena->_vptr_Arena[3])();
        }
        getBlob<capnp::Text>();
        pWVar12 = (WirePointer *)0x0;
        pWVar15 = pWVar14;
      }
    }
LAB_0018377f:
    bVar16 = pWVar12 == (WirePointer *)0x0;
    if (!bVar16) {
      if ((*(uint64_t *)&(pWVar15->offsetAndKind).value & 3) == 1) {
        uVar2 = (pWVar15->field_1).upper32Bits;
        if ((uVar2 & 7) == 2) {
          uVar13 = uVar2 >> 3;
          pWVar15 = (WirePointer *)(ulong)uVar13;
          if (pSVar6 == (SegmentReader *)0x0) {
LAB_001837f9:
            if (7 < uVar2) {
              pWVar15 = (WirePointer *)(ulong)(uVar13 - 1);
              if (*(char *)((long)&(pWVar12->offsetAndKind).value +
                           (long)&(pWVar15->offsetAndKind).value) == '\0') {
                pWVar15 = (WirePointer *)((long)&(pWVar15->offsetAndKind).value + 1);
                bVar16 = false;
              }
              else {
                getBlob<capnp::Text>();
                bVar16 = true;
              }
              goto LAB_0018383d;
            }
            getBlob<capnp::Text>();
          }
          else {
            uVar11 = (ulong)(uVar13 + 7 >> 3);
            if (((long)pWVar12 - (long)(pSVar6->ptr).ptr >> 3) + uVar11 <= (pSVar6->ptr).size_) {
              uVar10 = pSVar6->readLimiter->limit;
              if (uVar11 <= uVar10) {
                pSVar6->readLimiter->limit = uVar10 - uVar11;
                goto LAB_001837f9;
              }
              (*pSVar6->arena->_vptr_Arena[3])();
            }
            getBlob<capnp::Text>();
          }
          bVar16 = true;
          goto LAB_0018383d;
        }
        getBlob<capnp::Text>();
      }
      else {
        getBlob<capnp::Text>();
      }
      bVar16 = true;
    }
LAB_0018383d:
    if (!bVar16) goto LAB_00183855;
  }
  pWVar12 = (WirePointer *)0x1e3c21;
  if (defaultValue != (void *)0x0) {
    pWVar12 = (WirePointer *)defaultValue;
  }
  pWVar15 = (WirePointer *)((ulong)defaultSize + 1);
LAB_00183855:
  RVar17.super_StringPtr.content.size_ = (size_t)pWVar15;
  RVar17.super_StringPtr.content.ptr = (char *)pWVar12;
  return (Reader)RVar17.super_StringPtr.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}